

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bltrimws(bstring b)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  int iVar4;
  ushort **ppuVar5;
  ulong uVar6;
  
  iVar4 = -1;
  if (((b != (bstring)0x0) && (puVar3 = b->data, puVar3 != (uchar *)0x0)) && (0 < b->mlen)) {
    uVar2 = b->slen;
    if (((int)uVar2 <= b->mlen) && (-1 < (int)uVar2)) {
      if ((ulong)uVar2 != 0) {
        uVar6 = 0;
        do {
          uVar1 = puVar3[uVar6];
          if ((long)(char)uVar1 < 0) {
LAB_00118fb0:
            iVar4 = bdelete(b,0,(int)uVar6);
            return iVar4;
          }
          ppuVar5 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar5 + (long)(char)uVar1 * 2 + 1) & 0x20) == 0)
          goto LAB_00118fb0;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      *puVar3 = '\0';
      b->slen = 0;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int bltrimws (bstring b) {
int i, len;

	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;

	for (len = b->slen, i = 0; i < len; i++) {
		if (!wspace (b->data[i])) {
			return bdelete (b, 0, i);
		}
	}

	b->data[0] = (unsigned char) '\0';
	b->slen = 0;
	return 0;
}